

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  char *pcVar1;
  size_type sVar2;
  undefined8 uVar3;
  bool bVar4;
  TokenType TVar5;
  Result RVar6;
  Enum EVar7;
  Expr *pEVar8;
  undefined *puVar9;
  ExprType *this_00;
  Token *pTVar10;
  undefined1 auVar11 [8];
  Expr *pEVar12;
  Token local_9c8;
  Token local_978;
  Token local_928;
  Token local_8d8;
  Token local_888;
  Token local_838;
  Token local_7e8;
  Token local_798;
  Token local_748;
  Token local_6f8;
  Token local_6a8;
  Token local_658;
  Token local_608;
  Token local_5b8;
  Token local_568;
  Token local_518;
  Token local_4c8;
  undefined8 local_478;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined8 uStack_464;
  Token local_458;
  Token local_408;
  Token local_3b8;
  Token local_368;
  Token local_318;
  Token local_2c8;
  Token local_278;
  Token local_228;
  _func_int **pp_Stack_1d8;
  uint64_t lane_idx;
  undefined4 uStack_1c8;
  undefined8 uStack_1c4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_198;
  char *pcStack_190;
  size_type local_188;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_180;
  undefined8 local_178;
  char *pcStack_170;
  size_type local_168;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_160;
  undefined8 local_158;
  char *pcStack_150;
  size_type local_148;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_140;
  undefined8 local_138;
  char *pcStack_130;
  size_type local_128;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_120;
  undefined8 local_118;
  char *pcStack_110;
  size_type local_108;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_100;
  undefined8 local_f8;
  char *pcStack_f0;
  size_type local_e8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_e0;
  undefined8 local_d8;
  char *pcStack_d0;
  size_type local_c8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  size_type local_a8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_a0;
  undefined1 auStack_98 [8];
  Token token;
  Location loc;
  
  GetToken((Token *)auStack_98,this);
  uVar3 = token.loc.field_1.field_1.offset;
  sVar2 = token.loc.filename.size_;
  pcVar1 = token.loc.filename.data_;
  token.field_2._32_8_ = auStack_98;
  Token::~Token((Token *)auStack_98);
  TVar5 = Peek(this,0);
  loc.filename.data_._0_4_ = SUB84(pcVar1,0);
  loc.filename.data_._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  loc.filename.size_._0_4_ = (int)sVar2;
  loc.filename.size_._4_4_ = (int)(sVar2 >> 0x20);
  loc.field_1.field_0.line = (int)uVar3;
  loc.field_1.field_0.first_column = SUB84(uVar3,4);
  switch(TVar5) {
  case AtomicLoad:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_108 = sVar2;
    aStack_100.offset = uVar3;
    local_118 = token.field_2._32_8_;
    pcStack_110 = pcVar1;
    Token::Token(&local_318,(Token *)auStack_98);
    loc_00.filename.size_ = (size_type)pcStack_110;
    loc_00.filename.data_ = (char *)local_118;
    loc_00.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_108;
    loc_00.field_1._8_8_ = aStack_100.offset;
    RVar6 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                      (this,loc_00,&local_318,out_expr);
    pTVar10 = &local_318;
    goto LAB_00f5e875;
  case AtomicRmw:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_c8 = sVar2;
    aStack_c0.offset = uVar3;
    local_d8 = token.field_2._32_8_;
    pcStack_d0 = pcVar1;
    Token::Token(&local_278,(Token *)auStack_98);
    loc_12.filename.size_ = (size_type)pcStack_d0;
    loc_12.filename.data_ = (char *)local_d8;
    loc_12.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_c8;
    loc_12.field_1._8_8_ = aStack_c0.offset;
    RVar6 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                      (this,loc_12,&local_278,out_expr);
    pTVar10 = &local_278;
    goto LAB_00f5e875;
  case AtomicRmwCmpxchg:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_a8 = sVar2;
    aStack_a0.offset = uVar3;
    local_b8 = token.field_2._32_8_;
    pcStack_b0 = pcVar1;
    Token::Token(&local_228,(Token *)auStack_98);
    loc_16.filename.size_ = (size_type)pcStack_b0;
    loc_16.filename.data_ = (char *)local_b8;
    loc_16.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_a8;
    loc_16.field_1._8_8_ = aStack_a0.offset;
    RVar6 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                      (this,loc_16,&local_228,out_expr);
    pTVar10 = &local_228;
    goto LAB_00f5e875;
  case AtomicStore:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_e8 = sVar2;
    aStack_e0.offset = uVar3;
    local_f8 = token.field_2._32_8_;
    pcStack_f0 = pcVar1;
    Token::Token(&local_2c8,(Token *)auStack_98);
    loc_10.filename.size_ = (size_type)pcStack_f0;
    loc_10.filename.data_ = (char *)local_f8;
    loc_10.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_e8;
    loc_10.field_1._8_8_ = aStack_e0.offset;
    RVar6 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                      (this,loc_10,&local_2c8,out_expr);
    pTVar10 = &local_2c8;
    goto LAB_00f5e875;
  case AtomicWait:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_128 = sVar2;
    aStack_120.offset = uVar3;
    local_138 = token.field_2._32_8_;
    pcStack_130 = pcVar1;
    Token::Token(&local_368,(Token *)auStack_98);
    loc_15.filename.size_ = (size_type)pcStack_130;
    loc_15.filename.data_ = (char *)local_138;
    loc_15.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_128;
    loc_15.field_1._8_8_ = aStack_120.offset;
    RVar6 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                      (this,loc_15,&local_368,out_expr);
    pTVar10 = &local_368;
    goto LAB_00f5e875;
  case AtomicWake:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    local_148 = sVar2;
    aStack_140.offset = uVar3;
    local_158 = token.field_2._32_8_;
    pcStack_150 = pcVar1;
    Token::Token(&local_3b8,(Token *)auStack_98);
    loc_18.filename.size_ = (size_type)pcStack_150;
    loc_18.filename.data_ = (char *)local_158;
    loc_18.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_148;
    loc_18.field_1._8_8_ = aStack_140.offset;
    RVar6 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)5>>
                      (this,loc_18,&local_3b8,out_expr);
    pTVar10 = &local_3b8;
LAB_00f5e875:
    Token::~Token(pTVar10);
    pTVar10 = (Token *)auStack_98;
LAB_00f5e881:
    Token::~Token(pTVar10);
    if (RVar6.enum_ == Error) {
      return (Result)Error;
    }
    goto LAB_00f5ec2e;
  case Binary:
    pEVar8 = (Expr *)operator_new(0x40);
    Consume((Token *)auStack_98,this);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) {
LAB_00f5ecc4:
      __assert_fail("HasOpcode()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.h"
                    ,0x6b,"Opcode wabt::Token::opcode() const");
    }
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar8->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar8->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar8->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar8->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar8->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar8->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar8->type_ = Binary;
    puVar9 = &OpcodeExpr<(wabt::ExprType)6>::vtable;
    goto LAB_00f5e27b;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                  ,0x648,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume(&local_888,this);
    Token::~Token(&local_888);
    loc_17.filename.size_ = (size_type)pcVar1;
    loc_17.filename.data_ = (char *)token.field_2._32_8_;
    loc_17.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_17.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)8>>(this,loc_17,out_expr);
    break;
  case BrIf:
    Consume(&local_838,this);
    Token::~Token(&local_838);
    loc_08.filename.size_ = (size_type)pcVar1;
    loc_08.filename.data_ = (char *)token.field_2._32_8_;
    loc_08.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_08.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>(this,loc_08,out_expr);
    break;
  case BrTable:
    Consume(&local_7e8,this);
    Token::~Token(&local_7e8);
    MakeUnique<wabt::BrTableExpr,wabt::Location&>
              ((wabt *)auStack_98,(Location *)((long)&token.field_2.literal_.text.field_2 + 8));
    bVar4 = ParseVarListOpt(this,(VarVector *)((long)auStack_98 + 0x40));
    if (bVar4) {
      Var::operator=((Var *)&((Expr *)((long)auStack_98 + 0x40))->loc,
                     (Var *)&(((Expr *)((long)auStack_98 + 0x40))->
                             super_intrusive_list_base<wabt::Expr>).next_[-2].type_);
      this_00 = &(((Expr *)((long)auStack_98 + 0x40))->super_intrusive_list_base<wabt::Expr>).next_
                 [-2].type_;
      (((Expr *)((long)auStack_98 + 0x40))->super_intrusive_list_base<wabt::Expr>).next_ =
           (Expr *)this_00;
      Var::~Var((Var *)this_00);
      auVar11 = auStack_98;
      auStack_98 = (undefined1  [8])0x0;
      pEVar8 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)auVar11;
      if (pEVar8 != (Expr *)0x0) {
        (*pEVar8->_vptr_Expr[1])();
        goto LAB_00f5e0c4;
      }
    }
    else {
LAB_00f5e0c4:
      if (auStack_98 != (undefined1  [8])0x0) {
        (*(*(_func_int ***)auStack_98)[1])();
      }
      if (!bVar4) {
        return (Result)Error;
      }
    }
    goto LAB_00f5ec2e;
  case Call:
    Consume(&local_748,this);
    Token::~Token(&local_748);
    loc_07.filename.size_ = (size_type)pcVar1;
    loc_07.filename.data_ = (char *)token.field_2._32_8_;
    loc_07.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_07.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)11>>(this,loc_07,out_expr);
    break;
  case CallIndirect:
    Consume(&local_6f8,this);
    Token::~Token(&local_6f8);
    MakeUnique<wabt::CallIndirectExpr,wabt::Location&>
              ((wabt *)auStack_98,(Location *)((long)&token.field_2.literal_.text.field_2 + 8));
    RVar6 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)auStack_98 + 0x40));
    if (RVar6.enum_ == Error) goto LAB_00f5e99c;
    RVar6 = ParseUnboundFuncSignature
                      (this,(FuncSignature *)
                            &(((Expr *)((long)auStack_98 + 0x80))->
                             super_intrusive_list_base<wabt::Expr>).prev_);
    goto LAB_00f5e993;
  case Compare:
    pEVar8 = (Expr *)operator_new(0x40);
    Consume((Token *)auStack_98,this);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f5ecc4;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar8->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar8->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar8->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar8->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar8->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar8->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar8->type_ = Compare;
    puVar9 = &OpcodeExpr<(wabt::ExprType)13>::vtable;
LAB_00f5e27b:
    pEVar8->_vptr_Expr = (_func_int **)(puVar9 + 0x10);
    *(TokenType *)&pEVar8->field_0x3c = token.token_type_;
    pEVar12 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar8;
    goto LAB_00f5ebcb;
  case Const:
    uStack_1c8 = 0;
    uStack_1c4 = 0;
    pp_Stack_1d8 = (_func_int **)0x0;
    lane_idx._0_4_ = 0;
    lane_idx._4_4_ = 0;
    Const::Const((Const *)auStack_98,0);
    RVar6 = ParseConst(this,(Const *)auStack_98);
    if (RVar6.enum_ == Error) {
      return (Result)Error;
    }
    pEVar8 = (Expr *)operator_new(0x78);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
    ((long)&(pEVar8->loc).field_1 + 8))->offset = uVar3;
    pEVar8->type_ = Const;
    pEVar8->_vptr_Expr = (_func_int **)&PTR__Expr_01544e68;
    pEVar8[1]._vptr_Expr = (_func_int **)auStack_98;
    pEVar8[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)token.loc.filename.data_;
    pEVar8[1].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)token.loc.filename.size_;
    pEVar8[1].loc.filename.data_ = (char *)token.loc.field_1.field_1.offset;
    pEVar8[1].loc.filename.size_ =
         CONCAT44(token.loc.field_1._12_4_,token.loc.field_1.field_0.last_column);
    pEVar8[1].loc.field_1.field_1.offset = CONCAT44(token._36_4_,token.token_type_);
    ((_Alloc_hider *)((long)&pEVar8[1].loc.field_1 + 8))->_M_p =
         (pointer)token.field_2.text_._M_dataplus._M_p;
    goto LAB_00f5eb4a;
  case Convert:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    pEVar8 = (Expr *)operator_new(0x40);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f5ecc4;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar8->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar8->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar8->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar8->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar8->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar8->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar8->type_ = Convert;
    puVar9 = &OpcodeExpr<(wabt::ExprType)15>::vtable;
    goto LAB_00f5ebbb;
  case Drop:
    Consume(&local_928,this);
    Token::~Token(&local_928);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uVar3;
    pEVar8->type_ = Drop;
    puVar9 = &ExprMixin<(wabt::ExprType)16>::vtable;
    goto LAB_00f5eb43;
  case GetGlobal:
    Consume(&local_5b8,this);
    Token::~Token(&local_5b8);
    loc_11.filename.size_ = (size_type)pcVar1;
    loc_11.filename.data_ = (char *)token.field_2._32_8_;
    loc_11.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_11.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)17>>(this,loc_11,out_expr);
    break;
  case GetLocal:
    Consume(&local_6a8,this);
    Token::~Token(&local_6a8);
    loc_09.filename.size_ = (size_type)pcVar1;
    loc_09.filename.data_ = (char *)token.field_2._32_8_;
    loc_09.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_09.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)18>>(this,loc_09,out_expr);
    break;
  case Load:
    local_188 = sVar2;
    aStack_180.offset = uVar3;
    local_198 = token.field_2._32_8_;
    pcStack_190 = pcVar1;
    Consume(&local_458,this);
    loc_19.filename.size_ = (size_type)pcStack_190;
    loc_19.filename.data_ = (char *)local_198;
    loc_19.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_188;
    loc_19.field_1._8_8_ = aStack_180.offset;
    RVar6 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)21>>
                      (this,loc_19,&local_458,out_expr);
    pTVar10 = &local_458;
    goto LAB_00f5e881;
  case MemoryCopy:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uVar3;
    pEVar8->type_ = MemoryCopy;
    puVar9 = &ExprMixin<(wabt::ExprType)23>::vtable;
    goto LAB_00f5eb43;
  case MemoryDrop:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_06.filename.size_ = (size_type)pcVar1;
    loc_06.filename.data_ = (char *)token.field_2._32_8_;
    loc_06.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_06.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>(this,loc_06,out_expr);
    break;
  case MemoryFill:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uVar3;
    pEVar8->type_ = MemoryFill;
    puVar9 = &ExprMixin<(wabt::ExprType)25>::vtable;
    goto LAB_00f5eb43;
  case MemoryGrow:
    Consume(&local_4c8,this);
    Token::~Token(&local_4c8);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uVar3;
    pEVar8->type_ = MemoryGrow;
    puVar9 = &ExprMixin<(wabt::ExprType)26>::vtable;
    goto LAB_00f5eb43;
  case MemoryInit:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_03.filename.size_ = (size_type)pcVar1;
    loc_03.filename.data_ = (char *)token.field_2._32_8_;
    loc_03.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_03.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)27>>(this,loc_03,out_expr);
    break;
  case MemorySize:
    Consume(&local_518,this);
    Token::~Token(&local_518);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uVar3;
    pEVar8->type_ = MemorySize;
    puVar9 = &ExprMixin<(wabt::ExprType)28>::vtable;
    goto LAB_00f5eb43;
  case TableCopy:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uVar3;
    pEVar8->type_ = TableCopy;
    puVar9 = &ExprMixin<(wabt::ExprType)41>::vtable;
    goto LAB_00f5eb43;
  case TableDrop:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_13.filename.size_ = (size_type)pcVar1;
    loc_13.filename.data_ = (char *)token.field_2._32_8_;
    loc_13.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_13.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)42>>(this,loc_13,out_expr);
    break;
  case TableInit:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_20.filename.size_ = (size_type)pcVar1;
    loc_20.filename.data_ = (char *)token.field_2._32_8_;
    loc_20.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_20.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)40>>(this,loc_20,out_expr);
    break;
  case Nop:
    Consume(&local_978,this);
    Token::~Token(&local_978);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uVar3;
    pEVar8->type_ = Nop;
    puVar9 = &ExprMixin<(wabt::ExprType)29>::vtable;
    goto LAB_00f5eb43;
  case Rethrow:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uVar3;
    pEVar8->type_ = Rethrow;
    puVar9 = &ExprMixin<(wabt::ExprType)30>::vtable;
    goto LAB_00f5eb43;
  case Return:
    Consume(&local_798,this);
    Token::~Token(&local_798);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = uVar3;
    pEVar8->type_ = Return;
    puVar9 = &ExprMixin<(wabt::ExprType)31>::vtable;
    goto LAB_00f5eb43;
  case ReturnCall:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_14.filename.size_ = (size_type)pcVar1;
    loc_14.filename.data_ = (char *)token.field_2._32_8_;
    loc_14.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_14.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)32>>(this,loc_14,out_expr);
    break;
  case ReturnCallIndirect:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    MakeUnique<wabt::ReturnCallIndirectExpr,wabt::Location&>
              ((wabt *)auStack_98,(Location *)((long)&token.field_2.literal_.text.field_2 + 8));
    RVar6 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)auStack_98 + 0x40));
    if (RVar6.enum_ == Error) goto LAB_00f5e99c;
    RVar6 = ParseUnboundFuncSignature
                      (this,(FuncSignature *)
                            &(((Expr *)((long)auStack_98 + 0x80))->
                             super_intrusive_list_base<wabt::Expr>).prev_);
LAB_00f5e993:
    auVar11 = auStack_98;
    if (RVar6.enum_ == Error) {
LAB_00f5e99c:
      if (auStack_98 != (undefined1  [8])0x0) {
        (*(*(_func_int ***)auStack_98)[1])();
      }
      return (Result)Error;
    }
    auStack_98 = (undefined1  [8])0x0;
    pEVar8 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)auVar11;
    if (pEVar8 != (Expr *)0x0) {
      (*pEVar8->_vptr_Expr[1])();
      auVar11 = auStack_98;
      goto LAB_00f5eb50;
    }
    goto LAB_00f5ec2e;
  case Select:
    Consume(&local_8d8,this);
    Token::~Token(&local_8d8);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
    ((long)&(pEVar8->loc).field_1 + 8))->offset = uVar3;
    pEVar8->type_ = Select;
    puVar9 = &ExprMixin<(wabt::ExprType)34>::vtable;
    goto LAB_00f5eb43;
  case SetGlobal:
    Consume(&local_568,this);
    Token::~Token(&local_568);
    loc_05.filename.size_ = (size_type)pcVar1;
    loc_05.filename.data_ = (char *)token.field_2._32_8_;
    loc_05.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_05.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)35>>(this,loc_05,out_expr);
    break;
  case SetLocal:
    Consume(&local_658,this);
    Token::~Token(&local_658);
    loc_04.filename.size_ = (size_type)pcVar1;
    loc_04.filename.data_ = (char *)token.field_2._32_8_;
    loc_04.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_04.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)36>>(this,loc_04,out_expr);
    break;
  case SimdLaneOp:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    RVar6 = ParseNat(this,(uint64_t *)&stack0xfffffffffffffe28);
    if (RVar6.enum_ == Error) {
LAB_00f5e019:
      Token::~Token((Token *)auStack_98);
      return (Result)Error;
    }
    pEVar8 = (Expr *)operator_new(0x48);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f5ecc4;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar8->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar8->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar8->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar8->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar8->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar8->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar8->type_ = SimdLaneOp;
    pEVar8->_vptr_Expr = (_func_int **)&PTR__Expr_01545728;
    *(TokenType *)&pEVar8->field_0x3c = token.token_type_;
    pEVar8[1]._vptr_Expr = pp_Stack_1d8;
    goto LAB_00f5ebc5;
  case SimdShuffleOp:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    uStack_468 = 0;
    uStack_464 = 0;
    local_478 = 0;
    uStack_470 = 0;
    uStack_46c = 0;
    Const::Const((Const *)&stack0xfffffffffffffe28,0);
    RVar6 = ParseSimdConst(this,(Const *)&stack0xfffffffffffffe28,I32,0x10);
    if (RVar6.enum_ == Error) goto LAB_00f5e019;
    pEVar8 = (Expr *)operator_new(0x50);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f5ecc4;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar8->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar8->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar8->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar8->type_ = SimdShuffleOp;
    pEVar8->_vptr_Expr = (_func_int **)&PTR__Expr_01545778;
    *(TokenType *)&pEVar8->field_0x3c = token.token_type_;
    *(undefined4 *)&pEVar8[1]._vptr_Expr = local_1b0;
    *(undefined4 *)((long)&pEVar8[1]._vptr_Expr + 4) = uStack_1ac;
    *(undefined4 *)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.next_ = uStack_1a8;
    *(undefined4 *)((long)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.next_ + 4) = uStack_1a4;
    goto LAB_00f5ebc5;
  case Store:
    local_168 = sVar2;
    aStack_160.offset = uVar3;
    local_178 = token.field_2._32_8_;
    pcStack_170 = pcVar1;
    Consume(&local_408,this);
    loc_02.filename.size_ = (size_type)pcStack_170;
    loc_02.filename.data_ = (char *)local_178;
    loc_02.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_168;
    loc_02.field_1._8_8_ = aStack_160.offset;
    RVar6 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)39>>
                      (this,loc_02,&local_408,out_expr);
    pTVar10 = &local_408;
    goto LAB_00f5e881;
  case TeeLocal:
    Consume(&local_608,this);
    Token::~Token(&local_608);
    loc_01.filename.size_ = (size_type)pcVar1;
    loc_01.filename.data_ = (char *)token.field_2._32_8_;
    loc_01.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_01.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)43>>(this,loc_01,out_expr);
    break;
  case Ternary:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    pEVar8 = (Expr *)operator_new(0x40);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f5ecc4;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar8->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar8->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar8->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar8->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar8->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar8->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar8->type_ = Ternary;
    puVar9 = &OpcodeExpr<(wabt::ExprType)44>::vtable;
    goto LAB_00f5ebbb;
  case Throw:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    Token::~Token((Token *)auStack_98);
    loc_21.filename.size_ = (size_type)pcVar1;
    loc_21.filename.data_ = (char *)token.field_2._32_8_;
    loc_21.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)sVar2;
    loc_21.field_1._8_8_ = uVar3;
    RVar6 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)45>>(this,loc_21,out_expr);
    break;
  case Unary:
    Consume((Token *)auStack_98,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_98);
    pEVar8 = (Expr *)operator_new(0x40);
    if (0x33 < token.loc.field_1.field_0.last_column - 0x29U) goto LAB_00f5ecc4;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar8->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar8->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar8->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar8->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar8->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar8->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar8->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar8->type_ = Unary;
    puVar9 = &OpcodeExpr<(wabt::ExprType)47>::vtable;
LAB_00f5ebbb:
    pEVar8->_vptr_Expr = (_func_int **)(puVar9 + 0x10);
    *(TokenType *)&pEVar8->field_0x3c = token.token_type_;
LAB_00f5ebc5:
    pEVar12 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar8;
LAB_00f5ebcb:
    if (pEVar12 != (Expr *)0x0) {
      (*pEVar12->_vptr_Expr[1])();
    }
    Token::~Token((Token *)auStack_98);
    goto LAB_00f5ec2e;
  case Last_Opcode:
    Consume(&local_9c8,this);
    Token::~Token(&local_9c8);
    pEVar8 = (Expr *)operator_new(0x40);
    (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar8->loc).filename.data_ = (char *)token.field_2._32_8_;
    (pEVar8->loc).filename.size_ = (size_type)pcVar1;
    (pEVar8->loc).field_1.field_1.offset = sVar2;
    ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
    ((long)&(pEVar8->loc).field_1 + 8))->offset = uVar3;
    pEVar8->type_ = Last;
    puVar9 = &ExprMixin<(wabt::ExprType)48>::vtable;
LAB_00f5eb43:
    pEVar8->_vptr_Expr = (_func_int **)(puVar9 + 0x10);
LAB_00f5eb4a:
    auVar11 = (undefined1  [8])
              (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar8;
LAB_00f5eb50:
    if (auVar11 != (undefined1  [8])0x0) {
      (*((Expr *)auVar11)->_vptr_Expr[1])();
    }
    goto LAB_00f5ec2e;
  }
  EVar7 = Error;
  if (RVar6.enum_ != Error) {
LAB_00f5ec2e:
    EVar7 = Ok;
  }
  return (Result)EVar7;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select:
      Consume();
      out_expr->reset(new SelectExpr(loc));
      break;

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrTable: {
      Consume();
      auto expr = MakeUnique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = MakeUnique<CallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<ReturnCallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::GetLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GetLocalExpr>(loc, out_expr));
      break;

    case TokenType::SetLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<SetLocalExpr>(loc, out_expr));
      break;

    case TokenType::TeeLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<TeeLocalExpr>(loc, out_expr));
      break;

    case TokenType::GetGlobal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GetGlobalExpr>(loc, out_expr));
      break;

    case TokenType::SetGlobal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<SetGlobalExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary:
      out_expr->reset(new BinaryExpr(Consume().opcode(), loc));
      break;

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryCopyExpr(loc));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryFillExpr(loc));
      break;

    case TokenType::MemoryDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      out_expr->reset(new MemorySizeExpr(loc));
      break;

    case TokenType::MemoryGrow:
      Consume();
      out_expr->reset(new MemoryGrowExpr(loc));
      break;

    case TokenType::TableCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new TableCopyExpr(loc));
      break;

    case TokenType::TableDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableInitExpr>(loc, out_expr));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RethrowExpr(loc));
      break;

    case TokenType::AtomicWake: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWakeExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint64_t lane_idx;
      CHECK_RESULT(ParseNat(&lane_idx));
      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      Const const_;
      CHECK_RESULT((ParseSimdConst(&const_, Type::I32, sizeof(v128))));
      out_expr->reset(
          new SimdShuffleOpExpr(token.opcode(), const_.v128_bits, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}